

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O1

opj_image_t *
pngtoimage_internal(opj_cparameters_t *params,FILE *reader,png_structp png,png_infop info,
                   png_uint_32 *pheight,OPJ_BYTE ***prows,OPJ_INT32 **prow32s)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  convert_32s_CXPX p_Var6;
  convert_XXx32s_C1R p_Var7;
  opj_cparameters_t *poVar8;
  byte bVar9;
  int iVar10;
  __jmp_buf_tag *__env;
  code *pcVar11;
  OPJ_BYTE **ppOVar12;
  size_t __size;
  OPJ_BYTE *pOVar13;
  ulong uVar14;
  OPJ_INT32 *pOVar15;
  ulong uVar16;
  ulong uVar17;
  char *__format;
  long lVar18;
  png_uint_32 height;
  png_uint_32 width;
  int color_type;
  int bit_depth;
  undefined4 local_134;
  double gamma;
  FILE *local_128;
  opj_image_t *local_120;
  OPJ_BYTE ***local_118;
  convert_XXx32s_C1R local_110;
  convert_32s_CXPX local_108;
  opj_cparameters_t *local_100;
  int filter_type;
  int compression_type;
  int interlace_type;
  OPJ_INT32 *planes [4];
  opj_image_cmptparm_t cmptparm [4];
  
  *pheight = 0;
  *prows = (OPJ_BYTE **)0x0;
  *prow32s = (OPJ_INT32 *)0x0;
  local_128 = reader;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
  iVar10 = _setjmp(__env);
  if (iVar10 != 0) {
    return (opj_image_t *)0x0;
  }
  height = 0;
  local_118 = prows;
  local_100 = params;
  png_init_io(png,local_128);
  png_set_sig_bytes(png,8);
  png_read_info(png,info);
  iVar10 = png_get_IHDR(png,info,&width,&height,&bit_depth,&color_type,&interlace_type,
                        &compression_type,&filter_type);
  if (iVar10 == 0) {
    return (opj_image_t *)0x0;
  }
  *pheight = height;
  if (color_type == 3) {
    png_set_expand(png);
  }
  iVar10 = png_get_valid(png,info,0x10);
  if (iVar10 != 0) {
    png_set_expand(png);
  }
  iVar10 = png_get_gAMA(png,info,&gamma);
  if (iVar10 == 0) {
    gamma = 1.0;
  }
  png_set_gamma(0x3ff0000000000000,gamma,png);
  png_read_update_info(png,info);
  bVar9 = png_get_color_type(png,info);
  color_type = (int)bVar9;
  if ((bVar9 < 7) && ((0x55U >> (color_type & 0x1fU) & 1) != 0)) {
    uVar1 = *(undefined4 *)(&DAT_0011a450 + (ulong)bVar9 * 4);
    uVar2 = *(uint *)(&DAT_0011a46c + (ulong)bVar9 * 4);
    uVar17 = (ulong)uVar2;
    p_Var6 = convert_32s_CXPX_LUT[uVar17];
    bVar9 = png_get_bit_depth(png,info);
    bit_depth = (int)bVar9;
    if (bVar9 < 0x11) {
      if ((0x116U >> (bit_depth & 0x1fU) & 1) != 0) {
        pcVar11 = convert_XXu32s_C1R_LUT[(uint)bVar9];
LAB_00114758:
        ppOVar12 = (OPJ_BYTE **)calloc((ulong)(height + 1),8);
        if (ppOVar12 == (OPJ_BYTE **)0x0) {
          pngtoimage_internal_cold_2();
          return (opj_image_t *)0x0;
        }
        *local_118 = ppOVar12;
        local_134 = uVar1;
        local_110 = pcVar11;
        if (height != 0) {
          uVar14 = 0;
          do {
            __size = png_get_rowbytes(png,info);
            pOVar13 = (OPJ_BYTE *)malloc(__size);
            ppOVar12[uVar14] = pOVar13;
            if (pOVar13 == (OPJ_BYTE *)0x0) {
              pngtoimage_internal_cold_1();
              return (opj_image_t *)0x0;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < height);
        }
        local_108 = p_Var6;
        png_read_image(png,ppOVar12);
        memset(cmptparm,0,0x90);
        poVar8 = local_100;
        iVar10 = local_100->subsampling_dx;
        iVar3 = local_100->subsampling_dy;
        lVar18 = 0;
        do {
          *(int *)((long)&cmptparm[0].prec + lVar18) = bit_depth;
          *(undefined4 *)((long)&cmptparm[0].sgnd + lVar18) = 0;
          *(int *)((long)&cmptparm[0].dx + lVar18) = iVar10;
          *(int *)((long)&cmptparm[0].dy + lVar18) = iVar3;
          *(png_uint_32 *)((long)&cmptparm[0].w + lVar18) = width;
          *(png_uint_32 *)((long)&cmptparm[0].h + lVar18) = height;
          lVar18 = lVar18 + 0x24;
        } while (uVar17 * 0x24 != lVar18);
        local_120 = (opj_image_t *)opj_image_create(uVar17,cmptparm,local_134);
        if (local_120 == (opj_image_t *)0x0) {
          return (opj_image_t *)0x0;
        }
        OVar4 = poVar8->image_offset_x0;
        local_120->x0 = OVar4;
        OVar5 = poVar8->image_offset_y0;
        local_120->y0 = OVar5;
        local_120->x1 = OVar4 + (width - 1) * poVar8->subsampling_dx + 1;
        local_120->y1 = (height - 1) * poVar8->subsampling_dy + OVar5 + 1;
        pOVar15 = (OPJ_INT32 *)malloc(width * uVar17 * 4);
        p_Var6 = local_108;
        p_Var7 = local_110;
        if (pOVar15 == (OPJ_INT32 *)0x0) {
          return local_120;
        }
        *prow32s = pOVar15;
        local_120->comps[uVar17 - 1].alpha = ~(ushort)uVar2 & 1;
        lVar18 = 0;
        uVar14 = uVar17;
        do {
          *(OPJ_INT32 **)((long)planes + lVar18) = (&local_120->comps->data)[lVar18];
          lVar18 = lVar18 + 8;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
        if (height == 0) {
          return local_120;
        }
        uVar14 = 0;
        do {
          (*p_Var7)(ppOVar12[uVar14],pOVar15,width * uVar17);
          (*p_Var6)(pOVar15,planes,(OPJ_SIZE_T)width);
          uVar16 = (ulong)width;
          planes[0] = planes[0] + uVar16;
          planes[1] = planes[1] + uVar16;
          planes[2] = planes[2] + uVar16;
          planes[3] = planes[3] + uVar16;
          uVar14 = uVar14 + 1;
        } while (uVar14 < height);
        return local_120;
      }
      if (bVar9 == 0x10) {
        pcVar11 = convert_16u32s_C1R;
        goto LAB_00114758;
      }
    }
    __format = "pngtoimage: bit depth %d is not supported\n";
  }
  else {
    __format = "pngtoimage: colortype %d is not supported\n";
  }
  fprintf(_stderr,__format);
  return (opj_image_t *)0x0;
}

Assistant:

static opj_image_t * pngtoimage_internal(opj_cparameters_t * params,
        FILE *reader,
        png_structp  png,
        png_infop    info,
        png_uint_32* pheight,
        OPJ_BYTE*** prows,
        OPJ_INT32** prow32s)
{
    *pheight = 0;
    *prows = NULL;
    *prow32s = NULL;

    if (setjmp(png_jmpbuf(png))) {
        return NULL;
    }

    {
        opj_image_t *image = NULL;
        opj_image_cmptparm_t cmptparm[4];
        OPJ_UINT32 nr_comp;
        convert_XXx32s_C1R cvtXXTo32s = NULL;
        convert_32s_CXPX cvtCxToPx = NULL;
        OPJ_INT32* planes[4];
        double gamma;
        int bit_depth, interlace_type, compression_type, filter_type;
        OPJ_UINT32 i;
        png_uint_32  width, height = 0U;
        int color_type;
        OPJ_BYTE** rows = NULL;
        OPJ_INT32* row32s = NULL;

        png_init_io(png, reader);
        png_set_sig_bytes(png, MAGIC_SIZE);

        png_read_info(png, info);

        if (png_get_IHDR(png, info, &width, &height,
                         &bit_depth, &color_type, &interlace_type,
                         &compression_type, &filter_type) == 0) {
            return image;
        }
        *pheight = height;

        /* png_set_expand():
         * expand paletted images to RGB, expand grayscale images of
         * less than 8-bit depth to 8-bit depth, and expand tRNS chunks
         * to alpha channels.
         */
        if (color_type == PNG_COLOR_TYPE_PALETTE) {
            png_set_expand(png);
        }

        if (png_get_valid(png, info, PNG_INFO_tRNS)) {
            png_set_expand(png);
        }
        /* We might want to expand background */
        /*
        if(png_get_valid(png, info, PNG_INFO_bKGD)) {
            png_color_16p bgnd;
            png_get_bKGD(png, info, &bgnd);
            png_set_background(png, bgnd, PNG_BACKGROUND_GAMMA_FILE, 1, 1.0);
        }
        */

        if (!png_get_gAMA(png, info, &gamma)) {
            gamma = 1.0;
        }

        /* we're not displaying but converting, screen gamma == 1.0 */
        png_set_gamma(png, 1.0, gamma);

        png_read_update_info(png, info);

        color_type = png_get_color_type(png, info);

        switch (color_type) {
        case PNG_COLOR_TYPE_GRAY:
            nr_comp = 1;
            break;
        case PNG_COLOR_TYPE_GRAY_ALPHA:
            nr_comp = 2;
            break;
        case PNG_COLOR_TYPE_RGB:
            nr_comp = 3;
            break;
        case PNG_COLOR_TYPE_RGB_ALPHA:
            nr_comp = 4;
            break;
        default:
            fprintf(stderr, "pngtoimage: colortype %d is not supported\n", color_type);
            return image;
        }
        cvtCxToPx = convert_32s_CXPX_LUT[nr_comp];
        bit_depth = png_get_bit_depth(png, info);

        switch (bit_depth) {
        case 1:
        case 2:
        case 4:
        case 8:
            cvtXXTo32s = convert_XXu32s_C1R_LUT[bit_depth];
            break;
        case 16: /* 16 bpp is specific to PNG */
            cvtXXTo32s = convert_16u32s_C1R;
            break;
        default:
            fprintf(stderr, "pngtoimage: bit depth %d is not supported\n", bit_depth);
            return image;
        }

        rows = (OPJ_BYTE**)calloc(height + 1, sizeof(OPJ_BYTE*));
        if (rows == NULL) {
            fprintf(stderr, "pngtoimage: memory out\n");
            return image;
        }
        *prows = rows;
        for (i = 0; i < height; ++i) {
            rows[i] = (OPJ_BYTE*)malloc(png_get_rowbytes(png, info));
            if (rows[i] == NULL) {
                fprintf(stderr, "pngtoimage: memory out\n");
                return image;
            }
        }
        png_read_image(png, rows);

        /* Create image */
        memset(cmptparm, 0, sizeof(cmptparm));
        for (i = 0; i < nr_comp; ++i) {
            /* bits_per_pixel: 8 or 16 */
            cmptparm[i].prec = (OPJ_UINT32)bit_depth;
            cmptparm[i].sgnd = 0;
            cmptparm[i].dx = (OPJ_UINT32)params->subsampling_dx;
            cmptparm[i].dy = (OPJ_UINT32)params->subsampling_dy;
            cmptparm[i].w = (OPJ_UINT32)width;
            cmptparm[i].h = (OPJ_UINT32)height;
        }

        image = opj_image_create(nr_comp, &cmptparm[0],
                                 (nr_comp > 2U) ? OPJ_CLRSPC_SRGB : OPJ_CLRSPC_GRAY);
        if (image == NULL) {
            return image;
        }
        image->x0 = (OPJ_UINT32)params->image_offset_x0;
        image->y0 = (OPJ_UINT32)params->image_offset_y0;
        image->x1 = (OPJ_UINT32)(image->x0 + (width  - 1) * (OPJ_UINT32)
                                 params->subsampling_dx + 1);
        image->y1 = (OPJ_UINT32)(image->y0 + (height - 1) * (OPJ_UINT32)
                                 params->subsampling_dy + 1);

        row32s = (OPJ_INT32 *)malloc((size_t)width * nr_comp * sizeof(OPJ_INT32));
        if (row32s == NULL) {
            return image;
        }
        *prow32s = row32s;

        /* Set alpha channel */
        image->comps[nr_comp - 1U].alpha = 1U - (nr_comp & 1U);

        for (i = 0; i < nr_comp; i++) {
            planes[i] = image->comps[i].data;
        }

        for (i = 0; i < height; ++i) {
            cvtXXTo32s(rows[i], row32s, (OPJ_SIZE_T)width * nr_comp);
            cvtCxToPx(row32s, planes, width);
            planes[0] += width;
            planes[1] += width;
            planes[2] += width;
            planes[3] += width;
        }

        return image;
    }
}